

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflectionTest_SetAllocatedExtensionMessageOnArenaTest_Test::TestBody
          (GeneratedMessageReflectionTest_SetAllocatedExtensionMessageOnArenaTest_Test *this)

{
  TestAllExtensions *message;
  Descriptor *base_descriptor;
  undefined1 local_1b0 [8];
  ReflectionTester reflection_tester;
  TestAllExtensions from_message2;
  TestAllExtensions from_message1;
  TestAllExtensions *to_message;
  Arena arena;
  GeneratedMessageReflectionTest_SetAllocatedExtensionMessageOnArenaTest_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&to_message);
  message = Arena::Create<proto2_unittest::TestAllExtensions>((Arena *)&to_message);
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&from_message2.field_0._impl_._cached_size_);
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)&reflection_tester.import_baz_);
  base_descriptor = proto2_unittest::TestAllExtensions::descriptor();
  TestUtil::ReflectionTester::ReflectionTester((ReflectionTester *)local_1b0,base_descriptor);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            ((ReflectionTester *)local_1b0,(Message *)&from_message2.field_0._impl_._cached_size_);
  TestUtil::ReflectionTester::SetAllFieldsViaReflection
            ((ReflectionTester *)local_1b0,(Message *)&reflection_tester.import_baz_);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_1b0,&message->super_Message,IS_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            ((Message *)&from_message2.field_0._impl_._cached_size_,&message->super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_1b0,&message->super_Message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            ((Message *)&reflection_tester.import_baz_,&message->super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_1b0,&message->super_Message,NOT_NULL);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToNullViaReflection
            ((ReflectionTester *)local_1b0,&message->super_Message);
  TestUtil::ReflectionTester::ExpectMessagesReleasedViaReflection
            ((ReflectionTester *)local_1b0,&message->super_Message,IS_NULL);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&reflection_tester.import_baz_);
  proto2_unittest::TestAllExtensions::~TestAllExtensions
            ((TestAllExtensions *)&from_message2.field_0._impl_._cached_size_);
  Arena::~Arena((Arena *)&to_message);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, SetAllocatedExtensionMessageOnArenaTest) {
  Arena arena;
  unittest::TestAllExtensions* to_message =
      Arena::Create<unittest::TestAllExtensions>(&arena);
  unittest::TestAllExtensions from_message1;
  unittest::TestAllExtensions from_message2;
  TestUtil::ReflectionTester reflection_tester(
      unittest::TestAllExtensions::descriptor());
  reflection_tester.SetAllFieldsViaReflection(&from_message1);
  reflection_tester.SetAllFieldsViaReflection(&from_message2);

  // Before moving fields, we expect the nested messages to be nullptr.
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::IS_NULL);

  // After fields are moved we should get non-nullptr releases.
  reflection_tester.SetAllocatedOptionalMessageFieldsToMessageViaReflection(
      &from_message1, to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::NOT_NULL);

  // Another move to make sure that we can SetAllocated several times.
  reflection_tester.SetAllocatedOptionalMessageFieldsToMessageViaReflection(
      &from_message2, to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::NOT_NULL);

  // After SetAllocatedOptionalMessageFieldsToNullViaReflection() we expect the
  // releases to be nullptr again.
  reflection_tester.SetAllocatedOptionalMessageFieldsToNullViaReflection(
      to_message);
  reflection_tester.ExpectMessagesReleasedViaReflection(
      to_message, TestUtil::ReflectionTester::IS_NULL);
}